

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Vec_IntFill(Vec_Int_t *p,int nSize,int Fill)

{
  int *piVar1;
  ulong uVar2;
  
  if (p->nCap < nSize) {
    if (p->pArray == (int *)0x0) {
      piVar1 = (int *)malloc((long)nSize << 2);
    }
    else {
      piVar1 = (int *)realloc(p->pArray,(long)nSize << 2);
    }
    p->pArray = piVar1;
    if (piVar1 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = nSize;
  }
  if (0 < nSize) {
    piVar1 = p->pArray;
    uVar2 = 0;
    do {
      piVar1[uVar2] = Fill;
      uVar2 = uVar2 + 1;
    } while ((uint)nSize != uVar2);
  }
  p->nSize = nSize;
  return;
}

Assistant:

static inline void Vec_IntFill( Vec_Int_t * p, int nSize, int Fill )
{
    int i;
    Vec_IntGrow( p, nSize );
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}